

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VWrmsNormVectorArray(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  int in_EDI;
  undefined8 uVar1;
  SUNErrCode ier;
  int i;
  SUNErrCode local_28;
  int local_24;
  
  if (*(long *)(*(long *)(*in_RSI + 8) + 0x120) == 0) {
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      uVar1 = (**(code **)(*(long *)(*in_RSI + 8) + 0xa8))
                        (in_RSI[local_24],*(undefined8 *)(in_RDX + (long)local_24 * 8));
      *(undefined8 *)(in_RCX + (long)local_24 * 8) = uVar1;
    }
    local_28 = 0;
  }
  else {
    local_28 = (**(code **)(*(long *)(*in_RSI + 8) + 0x120))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_28;
}

Assistant:

SUNErrCode N_VWrmsNormVectorArray(int nvec, N_Vector* X, N_Vector* W,
                                  sunrealtype* nrm)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (X[0]->ops->nvwrmsnormvectorarray != NULL)
  {
    ier = X[0]->ops->nvwrmsnormvectorarray(nvec, X, W, nrm);
  }
  else
  {
    for (i = 0; i < nvec; i++) { nrm[i] = X[0]->ops->nvwrmsnorm(X[i], W[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}